

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

NetType * slang::ast::anon_unknown_0::getDefaultNetType(Scope *scope,SourceLocation location)

{
  NetType *pNVar1;
  
  pNVar1 = Scope::getDefaultNetType(scope);
  if (pNVar1->netKind == Unknown) {
    Scope::addDiag(scope,(DiagCode)0xf10006,location);
    pNVar1 = scope->compilation->wireNetType;
  }
  return pNVar1;
}

Assistant:

const NetType& getDefaultNetType(const Scope& scope, SourceLocation location) {
    auto& netType = scope.getDefaultNetType();
    if (!netType.isError())
        return netType;

    scope.addDiag(diag::ImplicitNetPortNoDefault, location);
    return scope.getCompilation().getWireNetType();
}